

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

aiBone * findBone(aiScene *scene,char *name)

{
  uint uVar1;
  uint uVar2;
  aiMesh *paVar3;
  aiBone *paVar4;
  int iVar5;
  size_t m;
  ulong uVar6;
  size_t b;
  ulong uVar7;
  
  uVar1 = scene->mNumMeshes;
  uVar6 = 0;
  do {
    if (uVar6 == uVar1) {
      return (aiBone *)0x0;
    }
    paVar3 = scene->mMeshes[uVar6];
    uVar2 = paVar3->mNumBones;
    uVar7 = 0;
    while (uVar2 != uVar7) {
      paVar4 = paVar3->mBones[uVar7];
      iVar5 = strcmp(name,(paVar4->mName).data);
      uVar7 = uVar7 + 1;
      if (iVar5 == 0) {
        return paVar4;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

aiBone* findBone( const aiScene* scene, const char * name) {
    for (size_t m=0; m<scene->mNumMeshes; m++) {
        aiMesh * mesh = scene->mMeshes[m];
        for (size_t b=0; b<mesh->mNumBones; b++) {
            aiBone * bone = mesh->mBones[b];
            if (0 == strcmp(name, bone->mName.C_Str())) {
                return bone;
            }
        }
    }
    return NULL;
}